

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
               (int field_number,string *value,CodedOutputStream *output)

{
  ulong uVar1;
  void *data;
  undefined8 in_RDX;
  int in_EDI;
  LogMessage *in_stack_ffffffffffffff58;
  CodedOutputStream *in_stack_ffffffffffffff60;
  int size;
  undefined8 in_stack_ffffffffffffff68;
  LogLevel level;
  CodedOutputStream *in_stack_ffffffffffffff70;
  CodedOutputStream local_60;
  undefined4 local_8;
  
  local_60.impl_._60_4_ = SUB84((ulong)in_RDX >> 0x20,0);
  level = (LogLevel)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_8 = 2;
  MakeTag(in_EDI,WIRETYPE_LENGTH_DELIMITED);
  io::CodedOutputStream::WriteTag
            (in_stack_ffffffffffffff60,(uint32)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  uVar1 = std::__cxx11::string::size();
  if (0x7fffffff < uVar1) {
    in_stack_ffffffffffffff70 = &local_60;
    LogMessage::LogMessage
              ((LogMessage *)in_stack_ffffffffffffff70,level,(char *)in_stack_ffffffffffffff60,
               (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    LogMessage::operator<<
              ((LogMessage *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    LogFinisher::operator=((LogFinisher *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    LogMessage::~LogMessage((LogMessage *)0x601522);
  }
  std::__cxx11::string::size();
  io::CodedOutputStream::WriteVarint32(in_stack_ffffffffffffff70,level);
  size = local_60.impl_._60_4_;
  data = (void *)std::__cxx11::string::data();
  std::__cxx11::string::size();
  io::CodedOutputStream::WriteRawMaybeAliased(in_stack_ffffffffffffff70,data,size);
  return;
}

Assistant:

void WireFormatLite::WriteStringMaybeAliased(int field_number,
                                             const std::string& value,
                                             io::CodedOutputStream* output) {
  // String is for UTF-8 text only
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kint32max);
  output->WriteVarint32(value.size());
  output->WriteRawMaybeAliased(value.data(), value.size());
}